

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::hasAdditionalOps(string *unit_string)

{
  size_type sVar1;
  bool bVar2;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (unit_string,'{',0xffffffffffffffff);
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       unit_string,"*^(/",sVar1);
  bVar2 = true;
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (unit_string,'}',0xffffffffffffffff);
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unit_string,"*^(/",sVar1);
    bVar2 = sVar1 != 0xffffffffffffffff;
  }
  return bVar2;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}